

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binomial_heap.cpp
# Opt level: O2

BinomialNode * binomial_heap_top(BiHeap h)

{
  BinomialNode *pBVar1;
  Type TVar2;
  BinomialNode *pBVar3;
  
  pBVar3 = h->head;
  if (pBVar3 == (BinomialNode *)0x0) {
    pBVar1 = (BinomialNode *)0x0;
  }
  else {
    pBVar1 = pBVar3;
    TVar2 = pBVar3->key;
    while (pBVar3 = pBVar3->sibling, pBVar3 != (_BinomialNode *)0x0) {
      if (pBVar3->key < TVar2) {
        pBVar1 = pBVar3;
        TVar2 = pBVar3->key;
      }
    }
  }
  return pBVar1;
}

Assistant:

BinomialNode *binomial_heap_top(BiHeap h) {
    BinomialNode *y = NULL;
    BinomialNode *x = h->head;
    if (x != NULL) {
        int min = x->key;
        y = x;
        x = x->sibling;
        // travelling the list of the root nodes to find the minimum node
        while (x != NULL) {
            if (x->key < min) {
                min = x->key;
                y = x;
            }
            x = x->sibling;
        }
    }
    return y;
}